

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

List<Kernel::Formula_*> * Lib::List<Kernel::Formula_*>::reverse(List<Kernel::Formula_*> *l)

{
  bool bVar1;
  List<Kernel::Formula_*> *pLVar2;
  List<Kernel::Formula_*> *in_RDI;
  List<Kernel::Formula_*> *tl;
  List<Kernel::Formula_*> *result;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  bVar1 = isEmpty(in_RDI);
  if (bVar1) {
    local_8 = empty();
  }
  else {
    local_18 = empty();
    local_10 = in_RDI;
    while( true ) {
      bVar1 = isNonEmpty(local_10);
      if (!bVar1) break;
      pLVar2 = tail(local_10);
      setTail(local_10,local_18);
      local_18 = local_10;
      local_10 = pLVar2;
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

static List* reverse(List* l)
  {
    if (isEmpty(l)) return empty();

    List* result = empty();

    while (isNonEmpty(l)) {
      List* tl = l->tail();
      l->setTail(result);
      result = l;
      l = tl;
    }

    return result;
  }